

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,_4,_1,_0,_4,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::lazyAssign<Eigen::Matrix<double,4,1,0,4,1>>
          (PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *this,
          DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *other)

{
  undefined8 uVar1;
  
  resizeLike<Eigen::Matrix<double,4,1,0,4,1>>
            (this,(EigenBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)other);
  uVar1 = *(undefined8 *)(other + 8);
  *(undefined8 *)this = *(undefined8 *)other;
  *(undefined8 *)(this + 8) = uVar1;
  uVar1 = *(undefined8 *)(other + 0x18);
  *(undefined8 *)(this + 0x10) = *(undefined8 *)(other + 0x10);
  *(undefined8 *)(this + 0x18) = uVar1;
  return (Matrix<double,_4,_1,_0,_4,_1> *)this;
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }